

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
          (LessThanOrEqualToConstraint<double> *this,double rhs)

{
  ostream *this_00;
  string *in_RDI;
  double in_XMM0_Qa;
  stringstream iss;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  double local_10;
  
  local_10 = in_XMM0_Qa;
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)0x23d0ca);
  *(double *)(in_RDI + 0x20) = local_10;
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = std::operator<<(local_188,"less than or equal to");
  std::ostream::operator<<(this_00,local_10);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

LessThanOrEqualToConstraint(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "less than or equal to" << rhs;
      this->description_ = iss.str();
    }